

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::objectivec::IsInitName(string *name)

{
  bool bVar1;
  int iVar2;
  allocator local_9;
  
  if (IsInitName(std::__cxx11::string_const&)::init_names_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&IsInitName(std::__cxx11::string_const&)::init_names_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)IsInitName(std::__cxx11::string_const&)::init_names_abi_cxx11_,"init",
                 &local_9);
      __cxa_atexit(__cxx_global_array_dtor_12,0,&__dso_handle);
      __cxa_guard_release(&IsInitName(std::__cxx11::string_const&)::init_names_abi_cxx11_);
    }
  }
  bVar1 = anon_unknown_0::IsSpecialName
                    (name,IsInitName(std::__cxx11::string_const&)::init_names_abi_cxx11_,1);
  return bVar1;
}

Assistant:

bool IsInitName(const string& name) {
  static const string init_names[] = {"init"};
  return IsSpecialName(name, init_names,
                       sizeof(init_names) / sizeof(init_names[0]));
}